

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
slang::function_ref<std::__cxx11::string()>::
callback_fn<slang::syntax::SyntaxTree::create(slang::SourceManager&,std::span<slang::SourceBuffer_const,18446744073709551615ul>,slang::Bag_const&,std::span<slang::syntax::DefineDirectiveSyntax_const*const,18446744073709551615ul>,bool)::__0>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,function_ref<std::__cxx11::string()> *this,intptr_t callable)

{
  string_view sVar1;
  
  if ((*(long **)this)[1] == 1) {
    sVar1 = SourceManager::getRawFileName
                      (*(SourceManager **)(this + 8),(BufferID)*(uint32_t *)(**(long **)this + 0x18)
                      );
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,sVar1._M_str,sVar1._M_str + sVar1._M_len);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x622d69746c756d3c;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 6) = 0x3e7265666675622d;
    __return_storage_ptr__->_M_string_length = 0xe;
    (__return_storage_ptr__->field_2)._M_local_buf[0xe] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }